

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

boolean resists_blnd(monst *mon)

{
  permonst *ptr;
  obj *otmp;
  boolean bVar1;
  attack *paVar2;
  obj **ppoVar3;
  
  ptr = mon->data;
  if (mon != &youmonst) {
    if (mon->mblinded != '\0') {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) == 0) {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 & 0x80000) != 0 || (ptr->mflags1 & 0x1000) != 0) {
      return '\x01';
    }
    goto LAB_001e1546;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e1511;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e150c;
  }
  else {
LAB_001e150c:
    if (ublindf == (obj *)0x0) {
      return '\x01';
    }
LAB_001e1511:
    if (ublindf->oartifact != '\x1d') {
      return '\x01';
    }
  }
  if (u.usleep != 0) {
    return '\x01';
  }
LAB_001e1546:
  paVar2 = dmgtype_fromattack(ptr,0xb,0xd);
  if ((paVar2 == (attack *)0x0) &&
     (paVar2 = dmgtype_fromattack(ptr,0xb,0xf), paVar2 == (attack *)0x0)) {
    if (mon == &youmonst) {
      ppoVar3 = &uwep;
    }
    else {
      ppoVar3 = &mon->mw;
    }
    otmp = *ppoVar3;
    if (((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) ||
       (bVar1 = defends(0xb,otmp), bVar1 == '\0')) {
      if (mon == &youmonst) {
        ppoVar3 = &invent;
      }
      else {
        ppoVar3 = &mon->minvent;
      }
      do {
        ppoVar3 = &((obj *)ppoVar3)->nobj->nobj;
        if ((obj *)ppoVar3 == (obj *)0x0) {
          return '\0';
        }
      } while ((((obj *)ppoVar3)->oartifact == '\0') ||
              (bVar1 = protects(0xb,(obj *)ppoVar3), bVar1 == '\0'));
    }
  }
  return '\x01';
}

Assistant:

boolean resists_blnd(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	boolean is_you = (mon == &youmonst);
	struct obj *o;

	if (is_you ? (Blind || u.usleep) :
		(mon->mblinded || !mon->mcansee || !haseyes(ptr) ||
		    /* BUG: temporary sleep sets mfrozen, but since
			    paralysis does too, we can't check it */
		    mon->msleeping))
	    return TRUE;
	/* yellow light, Archon; !dust vortex, !cobra, !raven */
	if (dmgtype_fromattack(ptr, AD_BLND, AT_EXPL) ||
		dmgtype_fromattack(ptr, AD_BLND, AT_GAZE))
	    return TRUE;
	o = is_you ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_BLND, o))
	    return TRUE;
	o = is_you ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if (o->oartifact && protects(AD_BLND, o))
		return TRUE;
	return FALSE;
}